

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::get_file_size(char *pFilename,uint64 *file_size)

{
  int iVar1;
  undefined1 local_b0 [4];
  int result;
  stat stat_buf;
  uint64 *file_size_local;
  char *pFilename_local;
  
  *file_size = 0;
  stat_buf.__glibc_reserved[2] = (__syscall_slong_t)file_size;
  iVar1 = stat(pFilename,(stat *)local_b0);
  if (iVar1 == 0) {
    if (((uint)stat_buf.st_nlink & 0xf000) == 0x8000) {
      *(__dev_t *)stat_buf.__glibc_reserved[2] = stat_buf.st_rdev;
      pFilename_local._7_1_ = true;
    }
    else {
      pFilename_local._7_1_ = false;
    }
  }
  else {
    pFilename_local._7_1_ = false;
  }
  return pFilename_local._7_1_;
}

Assistant:

bool file_utils::get_file_size(const char* pFilename, uint64& file_size)
    {
        file_size = 0;
        struct stat stat_buf;
        int result = stat(pFilename, &stat_buf);
        if (result)
        {
            return false;
        }
        if (!S_ISREG(stat_buf.st_mode))
        {
            return false;
        }
        file_size = stat_buf.st_size;
        return true;
    }